

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O2

gdImagePtr gdImageCreateFromBmpCtx(gdIOCtxPtr infile)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bmp_info_t *result;
  bmp_info_t *info;
  gdImagePtr im;
  long lVar6;
  short sVar7;
  uint uVar8;
  int *piVar9;
  bool bVar10;
  double dVar11;
  int red;
  short *local_80;
  int *local_78;
  int *local_70;
  ushort local_66;
  int blue;
  int green;
  uint local_5c;
  int index;
  int local_34;
  
  result = (bmp_info_t *)gdCalloc(1,0x10);
  if (result == (bmp_info_t *)0x0) {
    return (gdImagePtr)0x0;
  }
  iVar3 = gdGetWordLSB((short *)result,infile);
  if ((((iVar3 == 0) || (iVar3 = gdGetIntLSB(&result->len,infile), iVar3 == 0)) ||
      (iVar3 = gdGetWordLSB((short *)&result->width,infile), iVar3 == 0)) ||
     (iVar3 = gdGetWordLSB((short *)((long)&result->width + 2),infile), iVar3 == 0))
  goto LAB_00113e29;
  piVar9 = &result->height;
  iVar3 = gdGetIntLSB(piVar9,infile);
  if (((iVar3 == 0) || (result->type != 0x4d42)) ||
     (info = (bmp_info_t *)gdCalloc(1,0x30), info == (bmp_info_t *)0x0)) goto LAB_00113e29;
  iVar3 = gdGetIntLSB(&info->len,infile);
  if (iVar3 != 0) {
    iVar3 = info->len;
    if (iVar3 == 0xc) {
      iVar3 = gdGetWordLSB((short *)&info->width,infile);
      if (iVar3 != 0) {
        iVar3 = gdGetWordLSB((short *)&info->height,infile);
        if (iVar3 != 0) {
          iVar3 = gdGetWordLSB(&info->numplanes,infile);
          if ((iVar3 != 0) && (iVar3 = gdGetWordLSB(&info->depth,infile), iVar3 != 0)) {
            info->topdown = '\0';
            sVar7 = info->depth;
            info->numcolors = 1 << ((byte)sVar7 & 0x1f);
            info->type = 1;
            if (((0 < info->width) && (((0 < info->height && (0 < info->numplanes)) && (0 < sVar7)))
                ) && (sVar7 != 0x1f)) {
LAB_00113ff4:
              if (sVar7 < 0x10) {
                im = gdImageCreate(info->width,info->height);
              }
              else {
                im = gdImageCreateTrueColor(info->width,info->height);
              }
              if (im != (gdImagePtr)0x0) {
                sVar7 = info->depth;
                if (sVar7 == 0x20) {
LAB_001140f1:
                  index = 0;
                  red = 0;
                  green = 0;
                  blue = 0;
                  local_66 = 0;
                  local_70 = (int *)CONCAT44(local_70._4_4_,1);
                  if (info->enctype != 0) goto LAB_0011477b;
                  lVar6 = gdTell(infile);
                  if (lVar6 != *piVar9) {
                    gdSeek(infile,*piVar9);
                  }
                  iVar4 = ((int)(info->depth / 8) * info->width) % 4;
                  iVar3 = 4 - iVar4;
                  if (iVar4 == 0) {
                    iVar3 = 0;
                  }
                  local_78 = (int *)CONCAT44(local_78._4_4_,iVar3 + 1);
                  local_80 = (short *)((ulong)local_80 & 0xffffffff00000000);
                  while( true ) {
                    if (info->height <= (int)(uint)local_80) break;
                    uVar8 = info->height + ~(uint)local_80;
                    if (info->topdown != '\0') {
                      uVar8 = (uint)local_80;
                    }
                    for (iVar3 = 0; iVar3 < info->width; iVar3 = iVar3 + 1) {
                      if (info->depth == 0x18) {
                        iVar4 = gdGetByte(&blue,infile);
                        if ((iVar4 == 0) || (iVar4 = gdGetByte(&green,infile), iVar4 == 0))
                        goto LAB_0011477b;
                        piVar9 = &red;
LAB_0011425d:
                        iVar4 = gdGetByte(piVar9,infile);
                        if (iVar4 == 0) goto LAB_0011477b;
                      }
                      else {
                        if (info->depth != 0x10) {
                          iVar4 = gdGetByte(&blue,infile);
                          if (((iVar4 != 0) && (iVar4 = gdGetByte(&green,infile), iVar4 != 0)) &&
                             (iVar4 = gdGetByte(&red,infile), iVar4 != 0)) {
                            piVar9 = &index;
                            goto LAB_0011425d;
                          }
                          goto LAB_0011477b;
                        }
                        iVar4 = gdGetWordLSB((short *)&local_66,infile);
                        if (iVar4 == 0) goto LAB_0011477b;
                        red = local_66 >> 7 & 0xf8;
                        green = local_66 >> 2 & 0xf8;
                        blue = (local_66 & 0x1f) << 3;
                      }
                      gdImageSetPixel(im,iVar3,uVar8,green * 0x100 + red * 0x10000 + blue);
                    }
                    iVar3 = (uint)local_78;
                    while (iVar3 + -1 != 0 && 0 < iVar3) {
                      iVar4 = gdGetByte(&red,infile);
                      iVar3 = iVar3 + -1;
                      if (iVar4 == 0) goto LAB_0011477b;
                    }
                    local_80 = (short *)CONCAT44(local_80._4_4_,(uint)local_80 + 1);
                  }
                }
                else if (sVar7 == 4) {
                  index = 0;
                  red = 0;
                  local_70 = (int *)CONCAT44(local_70._4_4_,1);
                  if ((info->enctype & 0xfffffffdU) != 0) goto LAB_0011477b;
                  uVar8 = info->numcolors;
                  if (uVar8 == 0) {
                    info->numcolors = 0x10;
                    uVar8 = 0x10;
                  }
                  else if (0x10 < uVar8) goto LAB_0011477b;
                  iVar3 = bmp_read_palette(im,infile,uVar8,(uint)(info->type == 2));
                  if (iVar3 != 0) goto LAB_0011477b;
                  im->colorsTotal = info->numcolors;
                  lVar6 = gdTell(infile);
                  if (lVar6 != *piVar9) {
                    gdSeek(infile,*piVar9);
                  }
                  dVar11 = ceil((double)info->width * 0.5);
                  iVar3 = 4 - (int)dVar11 % 4;
                  if ((int)dVar11 % 4 == 0) {
                    iVar3 = 0;
                  }
                  local_80 = (short *)CONCAT44(local_80._4_4_,iVar3);
                  if (info->enctype == 2) {
LAB_00114761:
                    iVar3 = bmp_read_rle(im,infile,info);
                    if (iVar3 != 0) goto LAB_0011477b;
                  }
                  else {
                    if (info->enctype != 0) goto LAB_0011477b;
                    local_80 = (short *)CONCAT44(local_80._4_4_,iVar3 + 1);
                    local_78 = (int *)((ulong)local_78 & 0xffffffff00000000);
                    while( true ) {
                      if (info->height <= (int)(uint)local_78) break;
                      uVar8 = info->height + ~(uint)local_78;
                      if (info->topdown != '\0') {
                        uVar8 = (uint)local_78;
                      }
                      for (iVar3 = 0; iVar3 < info->width; iVar3 = iVar3 + 2) {
                        iVar4 = gdGetByte(&red,infile);
                        if (iVar4 == 0) goto LAB_0011477b;
                        index = (uint)red >> 4 & 0xf;
                        if (im->open[(uint)index] != 0) {
                          im->open[(uint)index] = 0;
                        }
                        gdImageSetPixel(im,iVar3,uVar8,index);
                        if (info->width <= iVar3) break;
                        index = red & 0xf;
                        if (im->open[(uint)index] != 0) {
                          im->open[(uint)index] = 0;
                        }
                        gdImageSetPixel(im,iVar3 + 1,uVar8,index);
                      }
                      iVar3 = (uint)local_80;
                      while (iVar3 + -1 != 0 && 0 < iVar3) {
                        iVar4 = gdGetByte(&index,infile);
                        iVar3 = iVar3 + -1;
                        if (iVar4 == 0) goto LAB_0011477b;
                      }
                      local_78 = (int *)CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                    }
                  }
                }
                else if (sVar7 == 8) {
                  index = 0;
                  local_70 = (int *)CONCAT44(local_70._4_4_,1);
                  if (1 < (uint)info->enctype) goto LAB_0011477b;
                  uVar8 = info->numcolors;
                  if (uVar8 == 0) {
                    info->numcolors = 0x100;
                    uVar8 = 0x100;
                  }
                  else if (0x100 < uVar8) goto LAB_0011477b;
                  iVar3 = bmp_read_palette(im,infile,uVar8,(uint)(info->type == 2));
                  if (iVar3 != 0) goto LAB_0011477b;
                  im->colorsTotal = info->numcolors;
                  lVar6 = gdTell(infile);
                  if (lVar6 != *piVar9) {
                    gdSeek(infile,*piVar9);
                  }
                  iVar4 = info->width % 4;
                  iVar3 = 4 - iVar4;
                  if (iVar4 == 0) {
                    iVar3 = 0;
                  }
                  local_80 = (short *)CONCAT44(local_80._4_4_,iVar3);
                  if (info->enctype == 1) goto LAB_00114761;
                  if (info->enctype != 0) goto LAB_0011477b;
                  local_80 = (short *)CONCAT44(local_80._4_4_,iVar3 + 1);
                  local_78 = (int *)((ulong)local_78 & 0xffffffff00000000);
                  while( true ) {
                    if (info->height <= (int)(uint)local_78) break;
                    uVar8 = info->height + ~(uint)local_78;
                    if (info->topdown != '\0') {
                      uVar8 = (uint)local_78;
                    }
                    for (iVar3 = 0; iVar3 < info->width; iVar3 = iVar3 + 1) {
                      iVar4 = gdGetByte(&index,infile);
                      if (iVar4 == 0) goto LAB_0011477b;
                      if (im->open[index] != 0) {
                        im->open[index] = 0;
                      }
                      gdImageSetPixel(im,iVar3,uVar8,index);
                    }
                    iVar3 = (uint)local_80;
                    while (iVar3 + -1 != 0 && 0 < iVar3) {
                      iVar4 = gdGetByte(&index,infile);
                      iVar3 = iVar3 + -1;
                      if (iVar4 == 0) goto LAB_0011477b;
                    }
                    local_78 = (int *)CONCAT44(local_78._4_4_,(uint)local_78 + 1);
                  }
                }
                else {
                  if ((sVar7 == 0x10) || (sVar7 == 0x18)) goto LAB_001140f1;
                  if (sVar7 != 1) {
                    local_70 = (int *)CONCAT44(local_70._4_4_,1);
                    goto LAB_0011477b;
                  }
                  index = 0;
                  red = 0;
                  local_70 = (int *)CONCAT44(local_70._4_4_,1);
                  if (info->enctype != 0) goto LAB_0011477b;
                  uVar8 = info->numcolors;
                  if (uVar8 == 0) {
                    info->numcolors = 2;
                    uVar8 = 2;
                  }
                  else if (2 < uVar8) goto LAB_0011477b;
                  iVar3 = bmp_read_palette(im,infile,uVar8,(uint)(info->type == 2));
                  if (iVar3 != 0) goto LAB_0011477b;
                  im->colorsTotal = info->numcolors;
                  lVar6 = gdTell(infile);
                  if (lVar6 != *piVar9) {
                    gdSeek(infile,*piVar9);
                  }
                  dVar11 = ceil((double)info->width * 0.1);
                  local_34 = 4 - (int)dVar11 % 4;
                  if ((int)dVar11 % 4 == 0) {
                    local_34 = 0;
                  }
                  local_34 = local_34 + 1;
                  for (local_5c = 0; (int)local_5c < info->height; local_5c = local_5c + 1) {
                    uVar8 = info->height + ~local_5c;
                    if (info->topdown != '\0') {
                      uVar8 = local_5c;
                    }
                    local_78 = (int *)CONCAT44(local_78._4_4_,uVar8);
                    local_80 = (short *)0xffffffffffffffff;
                    for (iVar3 = 0; iVar4 = local_34, iVar3 < info->width; iVar3 = iVar3 + 8) {
                      iVar4 = gdGetByte(&red,infile);
                      if (iVar4 == 0) goto LAB_0011477b;
                      iVar4 = 0;
                      do {
                        if (iVar4 == 8) break;
                        bVar2 = (byte)(red << ((byte)iVar4 & 0x1f)) >> 7;
                        index = (int)bVar2;
                        if (im->open[bVar2] != 0) {
                          im->open[bVar2] = 0;
                        }
                        gdImageSetPixel(im,iVar3 + iVar4,(uint)local_78,index);
                        iVar5 = (int)local_80 + iVar4;
                        iVar4 = iVar4 + 1;
                      } while (iVar5 + 1 < info->width);
                      local_80 = (short *)(ulong)((int)local_80 + 8);
                    }
                    while (iVar4 + -1 != 0 && 0 < iVar4) {
                      iVar3 = gdGetByte(&index,infile);
                      iVar4 = iVar4 + -1;
                      if (iVar3 == 0) goto LAB_0011477b;
                    }
                  }
                }
                local_70 = (int *)((ulong)local_70 & 0xffffffff00000000);
LAB_0011477b:
                gdFree(result);
                gdFree(info);
                if ((int)local_70 != 0) {
                  gdImageDestroy(im);
                  return (gdImagePtr)0x0;
                }
                return im;
              }
            }
          }
        }
      }
    }
    else if (iVar3 == 0x28) {
LAB_00113d34:
      iVar3 = gdGetIntLSB(&info->width,infile);
      if (iVar3 != 0) {
        piVar1 = &info->height;
        iVar3 = gdGetIntLSB(piVar1,infile);
        if (iVar3 != 0) {
          iVar3 = gdGetWordLSB(&info->numplanes,infile);
          if (iVar3 != 0) {
            local_80 = &info->depth;
            iVar3 = gdGetWordLSB(local_80,infile);
            if ((((iVar3 != 0) && (iVar3 = gdGetIntLSB(&info->enctype,infile), iVar3 != 0)) &&
                (iVar3 = gdGetIntLSB(&info->size,infile), iVar3 != 0)) &&
               ((iVar3 = gdGetIntLSB(&info->hres,infile), iVar3 != 0 &&
                (iVar3 = gdGetIntLSB(&info->vres,infile), iVar3 != 0)))) {
              local_78 = &info->numcolors;
              iVar3 = gdGetIntLSB(local_78,infile);
              if (iVar3 != 0) {
                local_70 = &info->mincolors;
                iVar3 = gdGetIntLSB(local_70,infile);
                if (iVar3 != 0) {
                  iVar3 = *piVar1;
                  bVar10 = iVar3 < 0;
                  if (bVar10) {
                    *piVar1 = -iVar3;
                    iVar3 = 1;
                  }
                  info->topdown = bVar10;
                  info->type = 2;
                  if (((iVar3 != 0) && (0 < info->width)) &&
                     ((0 < info->numplanes &&
                      (((sVar7 = *local_80, 0 < sVar7 && (-1 < *local_78)) && (-1 < *local_70))))))
                  goto LAB_00113ff4;
                }
              }
            }
          }
        }
      }
    }
    else if (iVar3 == 0x40) {
      iVar3 = gdGetIntLSB(&info->width,infile);
      if (iVar3 != 0) {
        piVar1 = &info->height;
        iVar3 = gdGetIntLSB(piVar1,infile);
        if (iVar3 != 0) {
          iVar3 = gdGetWordLSB(&info->numplanes,infile);
          if (iVar3 != 0) {
            local_80 = &info->depth;
            iVar3 = gdGetWordLSB(local_80,infile);
            if (((iVar3 != 0) && (iVar3 = gdGetIntLSB(&info->enctype,infile), iVar3 != 0)) &&
               ((iVar3 = gdGetIntLSB(&info->size,infile), iVar3 != 0 &&
                ((iVar3 = gdGetIntLSB(&info->hres,infile), iVar3 != 0 &&
                 (iVar3 = gdGetIntLSB(&info->vres,infile), iVar3 != 0)))))) {
              local_78 = &info->numcolors;
              iVar3 = gdGetIntLSB(local_78,infile);
              if (iVar3 != 0) {
                local_70 = &info->mincolors;
                iVar3 = gdGetIntLSB(local_70,infile);
                if ((iVar3 != 0) && (iVar3 = gdGetBuf(&index,0x18,infile), iVar3 != 0)) {
                  iVar3 = *piVar1;
                  bVar10 = iVar3 < 0;
                  if (bVar10) {
                    *piVar1 = -iVar3;
                    iVar3 = 1;
                  }
                  info->topdown = bVar10;
                  info->type = 2;
                  if (((((iVar3 != 0) && (0 < info->width)) && (0 < info->numplanes)) &&
                      ((0 < *local_80 && (-1 < *local_78)))) && (-1 < *local_70)) {
                    sVar7 = *local_80;
                    goto LAB_00113ff4;
                  }
                }
              }
            }
          }
        }
      }
    }
    else if ((iVar3 == 0x7c) || (iVar3 == 0x6c)) goto LAB_00113d34;
  }
  gdFree(result);
  result = info;
LAB_00113e29:
  gdFree(result);
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromBmpCtx(gdIOCtxPtr infile)
{
	bmp_hdr_t *hdr;
	bmp_info_t *info;
	gdImagePtr im = NULL;
	int error = 0;

	if (!(hdr= (bmp_hdr_t *)gdCalloc(1, sizeof(bmp_hdr_t)))) {
		return NULL;
	}

	if (bmp_read_header(infile, hdr)) {
		gdFree(hdr);
		return NULL;
	}

	if (hdr->magic != 0x4d42) {
		gdFree(hdr);
		return NULL;
	}

	if (!(info = (bmp_info_t *)gdCalloc(1, sizeof(bmp_info_t)))) {
		gdFree(hdr);
		return NULL;
	}

	if (bmp_read_info(infile, info)) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	BMP_DEBUG(printf("Numcolours: %d\n", info->numcolors));
	BMP_DEBUG(printf("Width: %d\n", info->width));
	BMP_DEBUG(printf("Height: %d\n", info->height));
	BMP_DEBUG(printf("Planes: %d\n", info->numplanes));
	BMP_DEBUG(printf("Depth: %d\n", info->depth));
	BMP_DEBUG(printf("Offset: %d\n", hdr->off));

	if (info->depth >= 16) {
		im = gdImageCreateTrueColor(info->width, info->height);
	} else {
		im = gdImageCreate(info->width, info->height);
	}

	if (!im) {
		gdFree(hdr);
		gdFree(info);
		return NULL;
	}

	switch (info->depth) {
	case 1:
		BMP_DEBUG(printf("1-bit image\n"));
		error = bmp_read_1bit(im, infile, info, hdr);
		break;
	case 4:
		BMP_DEBUG(printf("4-bit image\n"));
		error = bmp_read_4bit(im, infile, info, hdr);
		break;
	case 8:
		BMP_DEBUG(printf("8-bit image\n"));
		error = bmp_read_8bit(im, infile, info, hdr);
		break;
	case 16:
	case 24:
	case 32:
		BMP_DEBUG(printf("Direct BMP image\n"));
		error = bmp_read_direct(im, infile, info, hdr);
		break;
	default:
		BMP_DEBUG(printf("Unknown bit count\n"));
		error = 1;
	}

	gdFree(hdr);
	gdFree(info);

	if (error) {
		gdImageDestroy(im);
		return NULL;
	}

	return im;
}